

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplicationPrivate::dispatchEnterLeave(QWidget *enter,QWidget *leave,QPointF *globalPosF)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  QWidget *pQVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  undefined8 uVar9;
  QPointingDevice *pQVar10;
  undefined8 uVar11;
  long *plVar12;
  WId WVar13;
  WId WVar14;
  QGraphicsProxyWidget *pQVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int i;
  ulong uVar19;
  undefined8 *puVar20;
  QHoverEvent *pQVar21;
  QArrayDataPointer<char16_t> *pQVar22;
  QWidget *w;
  parameter_type pQVar23;
  QWidget *w_2;
  long in_FS_OFFSET;
  bool bVar24;
  byte bVar25;
  QArrayDataPointer<char16_t> local_198;
  undefined8 local_178;
  undefined8 uStack_170;
  QEnterEvent enterEvent;
  undefined1 *puStack_160;
  QPointF local_118;
  QPointF local_108;
  QPointF local_f8;
  QHoverEvent he;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 local_78 [16];
  long local_68;
  undefined1 local_58 [16];
  ulong local_48;
  long local_38;
  
  bVar25 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((enter == leave) || (enter == (QWidget *)0x0 && leave == (QWidget *)0x0)) goto LAB_002be417;
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  local_78 = (undefined1  [16])0x0;
  local_68 = 0;
  if (enter == (QWidget *)0x0 || leave == (QWidget *)0x0) {
    bVar24 = false;
  }
  else {
    pQVar6 = QWidget::window(leave);
    pQVar7 = QWidget::window(enter);
    bVar24 = pQVar6 == pQVar7;
  }
  if (leave != (QWidget *)0x0 && !bVar24) {
    pQVar23 = leave;
    do {
      QList<QWidget_*>::append((QList<QWidget_*> *)local_58,pQVar23);
      if (((pQVar23->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) break;
      pQVar23 = *(parameter_type *)(*(long *)&pQVar23->field_0x8 + 0x10);
    } while (pQVar23 != (parameter_type)0x0);
  }
  if (enter != (QWidget *)0x0 && !bVar24) {
    pQVar23 = enter;
    do {
      QList<QWidget_*>::append((QList<QWidget_*> *)local_78,pQVar23);
      if (((pQVar23->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) break;
      pQVar23 = *(parameter_type *)(*(long *)&pQVar23->field_0x8 + 0x10);
    } while (pQVar23 != (parameter_type)0x0);
  }
  if (bVar24) {
    iVar4 = 0;
    pQVar6 = enter;
    while ((((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 &&
           (pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10), pQVar6 != (QWidget *)0x0)))
    {
      iVar4 = iVar4 + 1;
    }
    iVar16 = 0;
    pQVar6 = leave;
    while ((pQVar7 = enter, iVar1 = iVar4,
           ((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 &&
           (pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10), pQVar6 != (QWidget *)0x0)))
    {
      iVar16 = iVar16 + 1;
    }
    for (; iVar16 < iVar1; iVar1 = iVar1 + -1) {
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
    }
    pQVar6 = leave;
    if (iVar16 <= iVar4) {
      iVar4 = iVar16;
    }
    for (; iVar4 < iVar16; iVar16 = iVar16 + -1) {
      pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
    }
    while ((pQVar7 != pQVar6 &&
           (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0))) {
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
      pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
    }
    for (; leave != pQVar6; leave = *(QWidget **)(*(long *)&leave->field_0x8 + 0x10)) {
      QList<QWidget_*>::append((QList<QWidget_*> *)local_58,leave);
    }
    for (pQVar23 = enter; pQVar23 != pQVar7;
        pQVar23 = *(parameter_type *)(*(long *)&pQVar23->field_0x8 + 0x10)) {
      QList<QWidget_*>::append((QList<QWidget_*> *)local_78,pQVar23);
    }
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_88,Leave);
  for (uVar19 = 0; lVar17 = local_68, uVar19 < local_48; uVar19 = uVar19 + 1) {
    pQVar6 = *(QWidget **)(local_58._8_8_ + uVar19 * 8);
    pQVar7 = QApplication::activeModalWidget();
    if ((pQVar7 == (QWidget *)0x0) || (bVar24 = tryModalHelper(pQVar6,(QWidget **)0x0), bVar24)) {
      QCoreApplication::sendEvent(&pQVar6->super_QObject,(QEvent *)&local_88);
      bVar24 = QWidget::testAttribute_helper(pQVar6,WA_Hover);
      if (bVar24) {
        pQVar7 = QApplication::activePopupWidget();
        if (pQVar7 != (QWidget *)0x0) {
          pQVar7 = QApplication::activePopupWidget();
          pQVar8 = QWidget::window(pQVar6);
          if (pQVar7 != pQVar8) goto LAB_002be024;
        }
        puVar20 = &DAT_005e5688;
        pQVar21 = &he;
        for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
          *(undefined8 *)pQVar21 = *puVar20;
          puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
          pQVar21 = pQVar21 + (ulong)bVar25 * -0x10 + 8;
        }
        local_198.d = (Data *)0xbff0000000000000;
        local_198.ptr = (char16_t *)0xbff0000000000000;
        local_f8 = QWidget::mapFromGlobal(pQVar6,globalPosF);
        uVar5 = QGuiApplication::keyboardModifiers();
        _enterEvent = (undefined1  [16])0x0;
        uVar9 = QPointingDevice::primaryPointingDevice((QString *)&enterEvent);
        QHoverEvent::QHoverEvent(&he,0x80,&local_198,globalPosF,&local_f8,uVar5,uVar9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&enterEvent);
        notify_helper(*(QApplicationPrivate **)(QCoreApplication::self + 8),&pQVar6->super_QObject,
                      (QEvent *)&he);
        QHoverEvent::~QHoverEvent(&he);
      }
    }
LAB_002be024:
  }
  if (local_68 != 0) {
    cVar2 = qIsInf(globalPosF->xp);
    if (cVar2 == '\0') {
      local_f8 = *globalPosF;
    }
    else {
      local_f8.yp = 16777215.0;
      local_f8.xp = 16777215.0;
    }
    pQVar6 = QWidget::window(*(QWidget **)(local_78._8_8_ + (lVar17 + -1) * 8));
    local_108 = QWidget::mapFromGlobal(pQVar6,&local_f8);
    uVar9 = local_78._8_8_;
    for (lVar17 = local_68 << 3; lVar17 != 0; lVar17 = lVar17 + -8) {
      pQVar6 = *(QWidget **)(uVar9 + lVar17 + -8);
      pQVar7 = QApplication::activeModalWidget();
      if ((pQVar7 == (QWidget *)0x0) || (bVar24 = tryModalHelper(pQVar6,(QWidget **)0x0), bVar24)) {
        local_118.yp._0_4_ = 0xffffffff;
        local_118.xp = -NAN;
        local_118.yp._4_4_ = 0xffffffff;
        local_118 = QWidget::mapFromGlobal(pQVar6,&local_f8);
        puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
        _enterEvent = &DAT_aaaaaaaaaaaaaaaa;
        _he = (undefined1  [16])0x0;
        pQVar10 = (QPointingDevice *)QPointingDevice::primaryPointingDevice((QString *)&he);
        QEnterEvent::QEnterEvent(&enterEvent,&local_118,&local_108,&local_f8,pQVar10);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&he);
        QCoreApplication::sendEvent(&pQVar6->super_QObject,(QEvent *)&enterEvent);
        bVar24 = QWidget::testAttribute_helper(pQVar6,WA_Hover);
        if (bVar24) {
          pQVar7 = QApplication::activePopupWidget();
          if (pQVar7 != (QWidget *)0x0) {
            pQVar7 = QApplication::activePopupWidget();
            pQVar8 = QWidget::window(pQVar6);
            if (pQVar7 != pQVar8) goto LAB_002be287;
          }
          puVar20 = &DAT_005e5688;
          pQVar22 = (QArrayDataPointer<char16_t> *)&he;
          for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
            pQVar22->d = (Data *)*puVar20;
            puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
            pQVar22 = (QArrayDataPointer<char16_t> *)((long)pQVar22 + (ulong)bVar25 * -0x10 + 8);
          }
          local_178 = 0xbff0000000000000;
          uStack_170 = 0xbff0000000000000;
          uVar5 = QGuiApplication::keyboardModifiers();
          local_198.d = (Data *)0x0;
          local_198.ptr = (char16_t *)0x0;
          local_198.size = 0;
          uVar11 = QPointingDevice::primaryPointingDevice((QString *)&local_198);
          QHoverEvent::QHoverEvent(&he,0x7f,&local_108,&local_178,&local_f8,uVar5,uVar11);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
          plVar12 = (long *)QPointerEvent::point((longlong)&he);
          lVar18 = *plVar12;
          *(qreal *)(lVar18 + 0x30) = local_118.xp;
          *(qreal *)(lVar18 + 0x38) = local_118.yp;
          notify_helper(*(QApplicationPrivate **)(QCoreApplication::self + 8),&pQVar6->super_QObject
                        ,(QEvent *)&he);
          QHoverEvent::~QHoverEvent(&he);
        }
LAB_002be287:
        QEnterEvent::~QEnterEvent(&enterEvent);
      }
    }
  }
  if (enter == (QWidget *)0x0) {
    bVar24 = false;
  }
  else {
    bVar24 = true;
    if (((enter->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      bVar24 = QWidget::testAttribute_helper(enter,WA_DontShowOnScreen);
    }
  }
  pQVar6 = (QWidget *)0x0;
  for (uVar19 = 0; uVar19 < local_48; uVar19 = uVar19 + 1) {
    pQVar7 = *(QWidget **)(local_58._8_8_ + uVar19 * 8);
    if ((pQVar7 == (QWidget *)0x0) ||
       (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) break;
    bVar3 = QWidget::testAttribute_helper(pQVar7,WA_SetCursor);
    if (bVar3) {
      lVar17 = *(long *)&pQVar7->field_0x8;
      do {
        pQVar6 = *(QWidget **)(lVar17 + 0x10);
        if (pQVar6 == (QWidget *)0x0) {
          pQVar6 = (QWidget *)0x0;
          break;
        }
        lVar17 = *(long *)&pQVar6->field_0x8;
      } while ((*(byte *)(lVar17 + 0x1c2) & 4) != 0);
    }
  }
  if (pQVar6 == (QWidget *)0x0) {
LAB_002be378:
    if (bVar24 != false) goto LAB_002be382;
  }
  else {
    if (bVar24 == false) {
LAB_002be349:
      pQVar7 = QWidget::window(pQVar6);
      pQVar15 = QWidget::graphicsProxyWidget(pQVar7);
      if (pQVar15 == (QGraphicsProxyWidget *)0x0) {
        pQVar8 = desktop();
        pQVar7 = enter;
        if (pQVar8 != enter) {
          pQVar7 = pQVar6;
        }
        qt_qpa_set_cursor(pQVar7,true);
      }
      goto LAB_002be378;
    }
    WVar13 = QWidget::effectiveWinId(pQVar6);
    WVar14 = QWidget::effectiveWinId(enter);
    if (WVar13 != WVar14) goto LAB_002be349;
LAB_002be382:
    while ((((enter->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 &&
           ((enter->data->widget_attributes & 1) != 0))) {
      enter = *(QWidget **)(*(long *)&enter->field_0x8 + 0x10);
    }
    pQVar6 = QWidget::window(enter);
    pQVar15 = QWidget::graphicsProxyWidget(pQVar6);
    if (pQVar15 == (QGraphicsProxyWidget *)0x0) {
      qt_qpa_set_cursor(enter,true);
    }
    else {
      pQVar15 = QWidgetPrivate::nearestGraphicsProxyWidget(enter);
      QWidget::cursor((QWidget *)&he);
      QGraphicsItem::setCursor
                (&(pQVar15->super_QGraphicsWidget).super_QGraphicsObject.super_QGraphicsItem,
                 (QCursor *)&he);
      QCursor::~QCursor((QCursor *)&he);
    }
  }
  QEvent::~QEvent((QEvent *)&local_88);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)local_78);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)local_58);
LAB_002be417:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::dispatchEnterLeave(QWidget* enter, QWidget* leave, const QPointF &globalPosF)
{
    if ((!enter && !leave) || (enter == leave))
        return;

    QWidgetList leaveList;
    QWidgetList enterList;

    bool sameWindow = leave && enter && leave->window() == enter->window();
    if (leave && !sameWindow) {
        auto *w = leave;
        do {
            leaveList.append(w);
        } while (!w->isWindow() && (w = w->parentWidget()));
    }
    if (enter && !sameWindow) {
        auto *w = enter;
        do {
            enterList.append(w);
        } while (!w->isWindow() && (w = w->parentWidget()));
    }
    if (sameWindow) {
        int enterDepth = 0;
        int leaveDepth = 0;
        auto *e = enter;
        while (!e->isWindow() && (e = e->parentWidget()))
            enterDepth++;
        auto *l = leave;
        while (!l->isWindow() && (l = l->parentWidget()))
            leaveDepth++;
        QWidget* wenter = enter;
        QWidget* wleave = leave;
        while (enterDepth > leaveDepth) {
            wenter = wenter->parentWidget();
            enterDepth--;
        }
        while (leaveDepth > enterDepth) {
            wleave = wleave->parentWidget();
            leaveDepth--;
        }
        while (!wenter->isWindow() && wenter != wleave) {
            wenter = wenter->parentWidget();
            wleave = wleave->parentWidget();
        }

        for (auto *w = leave; w != wleave; w = w->parentWidget())
            leaveList.append(w);

        for (auto *w = enter; w != wenter; w = w->parentWidget())
            enterList.append(w);
    }

    QEvent leaveEvent(QEvent::Leave);
    for (int i = 0; i < leaveList.size(); ++i) {
        auto *w = leaveList.at(i);
        if (!QApplication::activeModalWidget() || QApplicationPrivate::tryModalHelper(w, nullptr)) {
            QCoreApplication::sendEvent(w, &leaveEvent);
            if (w->testAttribute(Qt::WA_Hover) &&
                (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == w->window())) {
                Q_ASSERT(instance());
                QHoverEvent he(QEvent::HoverLeave, QPointF(-1, -1), globalPosF, w->mapFromGlobal(globalPosF),
                               QGuiApplication::keyboardModifiers());
                qApp->d_func()->notify_helper(w, &he);
            }
        }
    }
    if (!enterList.isEmpty()) {
        // Guard against QGuiApplicationPrivate::lastCursorPosition initialized to qInf(), qInf().
        const QPointF globalPos = qIsInf(globalPosF.x())
            ? QPointF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX)
            : globalPosF;
        const QPointF windowPos = std::as_const(enterList).back()->window()->mapFromGlobal(globalPos);
        for (auto it = enterList.crbegin(), end = enterList.crend(); it != end; ++it) {
            auto *w = *it;
            if (!QApplication::activeModalWidget() || QApplicationPrivate::tryModalHelper(w, nullptr)) {
                const QPointF localPos = w->mapFromGlobal(globalPos);
                QEnterEvent enterEvent(localPos, windowPos, globalPos);
                QCoreApplication::sendEvent(w, &enterEvent);
                if (w->testAttribute(Qt::WA_Hover) &&
                        (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == w->window())) {
                    QHoverEvent he(QEvent::HoverEnter, windowPos, QPointF(-1, -1), globalPos,
                                   QGuiApplication::keyboardModifiers());
                    QMutableEventPoint::setPosition(he.point(0), localPos);
                    qApp->d_func()->notify_helper(w, &he);
                }
            }
        }
    }

#ifndef QT_NO_CURSOR
    // Update cursor for alien/graphics widgets.

    const bool enterOnAlien = (enter && (isAlien(enter) || enter->testAttribute(Qt::WA_DontShowOnScreen)));
    // Whenever we leave an alien widget on X11/QPA, we need to reset its nativeParentWidget()'s cursor.
    // This is not required on Windows as the cursor is reset on every single mouse move.
    QWidget *parentOfLeavingCursor = nullptr;
    for (int i = 0; i < leaveList.size(); ++i) {
        auto *w = leaveList.at(i);
        if (!isAlien(w))
            break;
        if (w->testAttribute(Qt::WA_SetCursor)) {
            QWidget *parent = w->parentWidget();
            while (parent && parent->d_func()->data.in_destructor)
                parent = parent->parentWidget();
            parentOfLeavingCursor = parent;
            //continue looping, we need to find the downest alien widget with a cursor.
            // (downest on the screen)
        }
    }
    //check that we will not call qt_x11_enforce_cursor twice with the same native widget
    if (parentOfLeavingCursor && (!enterOnAlien
        || parentOfLeavingCursor->effectiveWinId() != enter->effectiveWinId())) {
#if QT_CONFIG(graphicsview)
        if (!parentOfLeavingCursor->window()->graphicsProxyWidget())
#endif
        {
            if (enter == QApplicationPrivate::desktop()) {
                qt_qpa_set_cursor(enter, true);
            } else {
                qt_qpa_set_cursor(parentOfLeavingCursor, true);
            }
        }
    }
    if (enterOnAlien) {
        QWidget *cursorWidget = enter;
        while (!cursorWidget->isWindow() && !cursorWidget->isEnabled())
            cursorWidget = cursorWidget->parentWidget();

        if (!cursorWidget)
            return;

#if QT_CONFIG(graphicsview)
        if (cursorWidget->window()->graphicsProxyWidget()) {
            QWidgetPrivate::nearestGraphicsProxyWidget(cursorWidget)->setCursor(cursorWidget->cursor());
        } else
#endif
        {
            qt_qpa_set_cursor(cursorWidget, true);
        }
    }
#endif
}